

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_internal.h
# Opt level: O1

int exploration::
    sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
              (long seed,float *pdf_first,float *pdf_last,int *chosen_index)

{
  bool bVar1;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> pdf;
  float *pfVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  pdf._M_current._0_4_ = 1;
  if (pdf_first < pdf_last) {
    fVar4 = 0.0;
    pfVar2 = pdf_first;
    do {
      if (*pfVar2 <= 0.0 && *pfVar2 != 0.0) {
        *pfVar2 = 0.0;
      }
      fVar4 = fVar4 + *pfVar2;
      pfVar2 = pfVar2 + 1;
    } while (pfVar2 != pdf_last);
    if ((fVar4 == 0.0) && (!NAN(fVar4))) {
      *chosen_index = 0;
      *pdf_first = 1.0;
      return 0;
    }
    pdf._M_current._0_4_ = 0;
    if (pdf_first == pdf_last) {
      iVar3 = -1;
      bVar1 = false;
    }
    else {
      fVar6 = ((float)((uint)(seed * 0x66d5deece66d + 0x7fffffffU >> 0x19) & 0x7fffff | 0x3f800000)
              + -1.0) * fVar4;
      fVar5 = fVar4;
      if (fVar6 <= fVar4) {
        fVar5 = fVar6;
      }
      fVar6 = 0.0;
      iVar3 = -1;
      bVar1 = false;
      do {
        iVar3 = iVar3 + 1;
        fVar6 = fVar6 + *pdf_first;
        if ((!bVar1) && (fVar5 < fVar6)) {
          *chosen_index = iVar3;
          bVar1 = true;
        }
        *pdf_first = *pdf_first / fVar4;
        pdf_first = pdf_first + 1;
      } while (pdf_first != pdf_last);
    }
    if (!bVar1) {
      *chosen_index = iVar3;
      return (int)pdf._M_current;
    }
  }
  return (int)pdf._M_current;
}

Assistant:

int sample_after_normalizing(uint64_t seed, It pdf_first, It pdf_last, uint32_t& chosen_index, std::input_iterator_tag /* pdf_category */)
  {
    if (pdf_first == pdf_last || pdf_last < pdf_first)
      return E_EXPLORATION_BAD_RANGE;
    // Create a discrete_distribution based on the returned weights. This class handles the
    // case where the sum of the weights is < or > 1, by normalizing agains the sum.
    float total = 0.f;
    for (It pdf = pdf_first; pdf != pdf_last; ++pdf)
    {
      if (*pdf < 0)
        *pdf = 0;

      total += *pdf;
    }

    // assume the first is the best
    if (total == 0)
    {
      chosen_index = 0;
      *pdf_first = 1;
      return S_EXPLORATION_OK;
    }

    float draw = total * uniform_random_merand48(seed);
    if (draw > total) //make very sure that draw can not be greater than total.
      draw = total;

    bool index_found = false; //found chosen action
    float sum = 0.f;
    uint32_t i = 0;
    for (It pdf = pdf_first; pdf != pdf_last; ++pdf, ++i)
    {
      sum += *pdf;
      if (!index_found && sum > draw)
      {
        chosen_index = i;
        index_found = true;
      }
      *pdf /= total;
    }

    if(!index_found)
      chosen_index = i - 1;

    return S_EXPLORATION_OK;
  }